

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O3

void type_safe::detail::
     with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>::equal_visitor&,type_safe::tagged_union<int,double,debugger_type>const&,type_safe::union_types<int,double,debugger_type>,type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
     ::with_impl<double,debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,equal_visitor *param_2,
               basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
               *param_3)

{
  unsigned_long uVar1;
  
  uVar1 = (param_1->cur_type_).
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar1 == 3) {
    with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>::equal_visitor_&,_const_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::union_types<int,_double,_debugger_type>,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
    ::call<debugger_type>(0,param_1,param_2,param_3);
    return;
  }
  if (uVar1 == 2) {
    with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>::equal_visitor_&,_const_type_safe::tagged_union<int,_double,_debugger_type>_&,_type_safe::union_types<int,_double,_debugger_type>,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
    ::call<double>(0,param_1,param_2,param_3);
    return;
  }
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }